

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFlushFinishTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles2::Functional::anon_unknown_0::FlushFinishCase::iterate(FlushFinishCase *this)

{
  pointer pSVar1;
  undefined8 *puVar2;
  deUint32 *pdVar3;
  float fVar4;
  TestLog *pTVar5;
  qpWatchDog *dog;
  int iVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  deUint32 err;
  pointer __src;
  undefined4 extraout_var;
  RenderTarget *pRVar10;
  deUint64 dVar11;
  deUint64 dVar12;
  deUint64 dVar13;
  pointer value;
  MessageBuilder *pMVar14;
  TestError *this_00;
  runtime_error *this_01;
  int iVar15;
  long lVar16;
  LogNumber<float> *unit;
  string *psVar17;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  char *pcVar18;
  ulong uVar19;
  int ndx;
  char *pcVar20;
  ulong uVar21;
  value_type *__val;
  bool bVar22;
  float fVar23;
  LineParameters LVar24;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined1 auVar25 [16];
  allocator<char> local_4f4;
  allocator<char> local_4f3;
  allocator<char> local_4f2;
  allocator<char> local_4f1;
  allocator<char> local_4f0;
  allocator<char> local_4ef;
  allocator<char> local_4ee;
  allocator<char> local_4ed;
  allocator<char> local_4ec;
  allocator<char> local_4eb;
  allocator<char> local_4ea;
  allocator<char> local_4e9;
  LineParameters local_4e8;
  undefined8 uStack_4e0;
  undefined1 local_4d8 [8];
  undefined8 uStack_4d0;
  float local_4c8;
  float fStack_4c4;
  float fStack_4c0;
  float fStack_4bc;
  _Vector_base<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
  local_4b0;
  ScopedLogSection section;
  vector<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
  sortedSamples;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> readTimes;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> waitTimes;
  string local_3e0;
  string local_3c0;
  string local_3a0;
  string local_380;
  string local_360;
  string local_340;
  string local_320;
  string local_300;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  ScopedLogSection section_1;
  Random rnd;
  LogNumber<float> local_98;
  
  __src = (pointer)operator_new(600);
  local_4b0._M_impl.super__Vector_impl_data._M_finish = __src + 0x19;
  *(undefined8 *)__src = 0;
  __src->waitTime = 0;
  __src->readPixelsTime = 0;
  for (lVar16 = 0x18; lVar16 != 600; lVar16 = lVar16 + 0x18) {
    puVar2 = (undefined8 *)((long)&__src->numDrawCalls + lVar16);
    puVar2[2] = __src->readPixelsTime;
    dVar11 = __src->waitTime;
    *puVar2 = *(undefined8 *)__src;
    puVar2[1] = dVar11;
  }
  local_4b0._M_impl.super__Vector_impl_data._M_start = __src;
  local_4b0._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_4b0._M_impl.super__Vector_impl_data._M_finish;
  tcu::warmupCPU();
  iVar8 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar16 = CONCAT44(extraout_var,iVar8);
  iVar9 = (**(code **)(lVar16 + 0x780))((this->m_program->m_program).m_program);
  pRVar10 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar8 = pRVar10->m_width;
  pRVar10 = Context::getRenderTarget((this->super_TestCase).m_context);
  if (iVar9 < 0) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,(char *)0x0,"posLoc >= 0",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fFlushFinishTests.cpp"
               ,0xe9);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  iVar15 = pRVar10->m_height;
  if (0x7f < iVar15) {
    iVar15 = 0x80;
  }
  iVar6 = 0x80;
  if (iVar8 < 0x80) {
    iVar6 = iVar8;
  }
  (**(code **)(lVar16 + 0x1a00))(0,0,iVar6,iVar15);
  (**(code **)(lVar16 + 0x1680))((this->m_program->m_program).m_program);
  (**(code **)(lVar16 + 0x610))(iVar9);
  (**(code **)(lVar16 + 0x19f0))
            (iVar9,2,0x1406,0,0,
             Functional::(anonymous_namespace)::FlushFinishCase::setupRenderState()::s_positions);
  (**(code **)(lVar16 + 0x5e0))(0xbe2);
  (**(code **)(lVar16 + 0x120))(1,1);
  (**(code **)(lVar16 + 0x100))(0x8006);
  err = (**(code **)(lVar16 + 0x800))();
  glu::checkError(err,"Failed to set up render state",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fFlushFinishTests.cpp"
                  ,0xf2);
  render(this,1);
  readPixels(this);
  pTVar5 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&rnd,"CalibrationInfo",(allocator<char> *)&section_1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sortedSamples,"Calibration info",(allocator<char> *)&local_98);
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar5,(string *)&rnd,(string *)&sortedSamples);
  std::__cxx11::string::~string((string *)&sortedSamples);
  std::__cxx11::string::~string((string *)&rnd);
  rnd.m_rnd._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  pdVar3 = &rnd.m_rnd.z;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)pdVar3);
  std::operator<<((ostream *)pdVar3,"Calibrating maximum draw call count, target duration = ");
  std::ostream::operator<<(pdVar3,1000000);
  std::operator<<((ostream *)pdVar3," us");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&rnd,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)pdVar3);
  pdVar3 = &rnd.m_rnd.z;
  local_4e8.offset = 1.4013e-45;
  uVar19 = 0;
  iVar8 = 1;
  while( true ) {
    iVar9 = iVar8;
    dVar11 = deGetMicroseconds();
    render(this,iVar9);
    readPixels(this);
    dVar12 = deGetMicroseconds();
    rnd.m_rnd._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)pdVar3);
    std::operator<<((ostream *)pdVar3,"Duration with ");
    std::ostream::operator<<(pdVar3,iVar9);
    std::operator<<((ostream *)pdVar3," draw calls = ");
    uVar21 = dVar12 - dVar11;
    std::ostream::_M_insert<unsigned_long>((ulong)pdVar3);
    std::operator<<((ostream *)pdVar3," us");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&rnd,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)pdVar3);
    if (1000000 < uVar21) break;
    if (0xfffff < iVar9) goto LAB_00f12826;
    uVar19 = uVar21;
    iVar8 = iVar9 * 2;
    local_4e8.offset = (float)iVar9;
  }
  if (1 < iVar9) {
    fVar23 = (float)(uVar21 - uVar19) / (float)(iVar9 - (int)local_4e8.offset);
    fVar23 = floorf((1e+06 - ((float)(long)uVar19 - (float)(int)local_4e8.offset * fVar23)) / fVar23
                   );
    iVar8 = 0x100000;
    if ((int)fVar23 < 0x100000) {
      iVar8 = (int)fVar23;
    }
    iVar9 = 1;
    if (1 < iVar8) {
      iVar9 = iVar8;
    }
  }
LAB_00f12826:
  pTVar5 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sortedSamples,"MaxDrawCalls",(allocator<char> *)&local_3a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&section_1,"Maximum number of draw calls",(allocator<char> *)&local_3c0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,glcts::fixed_sample_locations_values + 1,
             (allocator<char> *)&local_3e0);
  unit = &local_98;
  tcu::LogNumber<long>::LogNumber
            ((LogNumber<long> *)&rnd,(string *)&sortedSamples,(string *)&section_1,&unit->m_name,
             QP_KEY_TAG_NONE,(long)iVar9);
  tcu::LogNumber<long>::write((LogNumber<long> *)&rnd,(int)pTVar5,__buf,(size_t)unit);
  tcu::LogNumber<long>::~LogNumber((LogNumber<long> *)&rnd);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&section_1);
  std::__cxx11::string::~string((string *)&sortedSamples);
  if (iVar9 < 10) {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&rnd,"Calibration failed, maximum draw call count is too low",
               (allocator<char> *)&sortedSamples);
    std::runtime_error::runtime_error(this_01,(string *)&rnd);
    *(undefined ***)this_01 = &PTR__runtime_error_01e225c0;
    __cxa_throw(this_01,&Functional::(anonymous_namespace)::CalibrationFailedException::typeinfo,
                std::runtime_error::~runtime_error);
  }
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  deRandom_init(&rnd.m_rnd,0x7b);
  for (lVar16 = 0x10; lVar16 != 0x268; lVar16 = lVar16 + 0x18) {
    iVar8 = de::Random::getInt(&rnd,1,iVar9);
    render(this,iVar8);
    dVar11 = deGetMicroseconds();
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])();
    dVar12 = deGetMicroseconds();
    readPixels(this);
    dVar13 = deGetMicroseconds();
    *(int *)((long)__src + lVar16 + -0x10) = iVar8;
    *(deUint64 *)((long)__src + lVar16 + -8) = dVar12 - dVar11;
    *(deUint64 *)((long)&__src->numDrawCalls + lVar16) = dVar13 - dVar12;
    dog = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_watchDog;
    if (dog != (qpWatchDog *)0x0) {
      qpWatchDog_touch(dog);
    }
  }
  getPointsFromSamples
            (&waitTimes,
             (vector<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
              *)&local_4b0,8);
  getPointsFromSamples
            (&readTimes,
             (vector<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
              *)&local_4b0,0x10);
  local_4e8 = deqp::gls::theilSenLinearRegression(&waitTimes);
  uStack_4e0 = extraout_XMM0_Qb;
  LVar24 = deqp::gls::theilSenLinearRegression(&readTimes);
  uStack_4d0 = extraout_XMM0_Qb_00;
  local_4d8._0_4_ = LVar24.offset;
  local_4d8._4_4_ = LVar24.coefficient;
  pTVar5 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&rnd,"Samples",(allocator<char> *)&local_98);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sortedSamples,"Samples",(allocator<char> *)&section);
  tcu::ScopedLogSection::ScopedLogSection(&section_1,pTVar5,(string *)&rnd,(string *)&sortedSamples)
  ;
  std::__cxx11::string::~string((string *)&sortedSamples);
  std::__cxx11::string::~string((string *)&rnd);
  sortedSamples.
  super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  sortedSamples.
  super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  sortedSamples.
  super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  value = (pointer)operator_new(600);
  fVar23 = (float)iVar9;
  local_4c8 = local_4e8.coefficient;
  fStack_4c4 = local_4e8.coefficient;
  fStack_4c0 = local_4e8.coefficient;
  fStack_4bc = local_4e8.coefficient;
  auVar25._0_4_ = fVar23 * local_4e8.coefficient;
  auVar25._4_4_ = fVar23 * (float)local_4d8._4_4_;
  auVar25._8_4_ = fVar23 * (float)uStack_4e0;
  auVar25._12_4_ = fVar23 * uStack_4e0._4_4_;
  auVar25 = divps(auVar25,_DAT_0182b330);
  local_4e8.coefficient = (float)local_4d8._4_4_;
  local_4e8.offset = (float)local_4d8._4_4_;
  uStack_4e0 = CONCAT44(local_4d8._4_4_,local_4d8._4_4_);
  pSVar1 = value + 0x19;
  _local_4d8 = auVar25;
  sortedSamples.
  super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
  ._M_impl.super__Vector_impl_data._M_start = value;
  sortedSamples.
  super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = pSVar1;
  memcpy(value,__src,600);
  sortedSamples.
  super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
  ._M_impl.super__Vector_impl_data._M_finish = pSVar1;
  std::
  __introsort_loop<__gnu_cxx::__normal_iterator<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample*,std::vector<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample,std::allocator<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<deqp::gles2::Functional::(anonymous_namespace)::CompareSampleDrawCount>>
            (value,pSVar1,8);
  std::
  __insertion_sort<__gnu_cxx::__normal_iterator<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample*,std::vector<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample,std::allocator<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample>>>,__gnu_cxx::__ops::_Iter_comp_iter<deqp::gles2::Functional::(anonymous_namespace)::CompareSampleDrawCount>>
            (value,value + 0x10);
  for (lVar16 = 0; lVar16 != 0xd8; lVar16 = lVar16 + 0x18) {
    std::
    __unguarded_linear_insert<__gnu_cxx::__normal_iterator<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample*,std::vector<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample,std::allocator<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample>>>,__gnu_cxx::__ops::_Val_comp_iter<deqp::gles2::Functional::(anonymous_namespace)::CompareSampleDrawCount>>
              ((long)&value[0x10].numDrawCalls + lVar16);
  }
  pdVar3 = &rnd.m_rnd.z;
  for (; value != sortedSamples.
                  super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
                  ._M_impl.super__Vector_impl_data._M_finish; value = value + 1) {
    rnd.m_rnd._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)pdVar3);
    pMVar14 = tcu::MessageBuilder::operator<<((MessageBuilder *)&rnd,&value->numDrawCalls);
    std::operator<<(&(pMVar14->m_str).super_basic_ostream<char,_std::char_traits<char>_>," calls:\t"
                   );
    pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,&value->waitTime);
    std::operator<<(&(pMVar14->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                    " us wait,\t");
    pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,&value->readPixelsTime);
    std::operator<<(&(pMVar14->m_str).super_basic_ostream<char,_std::char_traits<char>_>," us read")
    ;
    tcu::MessageBuilder::operator<<(pMVar14,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)pdVar3);
  }
  std::
  _Vector_base<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
  ::~_Vector_base(&sortedSamples.
                   super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
                 );
  tcu::ScopedLogSection::~ScopedLogSection(&section_1);
  pTVar5 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&section,"WaitCoefficient",&local_4e9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3a0,"Wait coefficient",&local_4ea);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3c0,glcts::fixed_sample_locations_values + 1,&local_4eb);
  psVar17 = &local_3c0;
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)&rnd,(string *)&section,&local_3a0,psVar17,QP_KEY_TAG_NONE,
             local_4c8);
  iVar8 = (int)pTVar5;
  tcu::LogNumber<float>::write((LogNumber<float> *)&rnd,iVar8,__buf_00,(size_t)psVar17);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3e0,"ReadCoefficient",&local_4ec);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"Read coefficient",&local_4ed);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2c0,glcts::fixed_sample_locations_values + 1,&local_4ee);
  psVar17 = &local_2c0;
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)&sortedSamples,&local_3e0,&local_2a0,psVar17,QP_KEY_TAG_NONE,
             local_4e8.offset);
  tcu::LogNumber<float>::write((LogNumber<float> *)&sortedSamples,iVar8,__buf_01,(size_t)psVar17);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2e0,"NormalizedWaitCoefficient",&local_4ef);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_300,"Normalized wait coefficient",&local_4f0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_320,glcts::fixed_sample_locations_values + 1,&local_4f1);
  psVar17 = &local_320;
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)&section_1,&local_2e0,&local_300,psVar17,QP_KEY_TAG_NONE,
             (float)local_4d8._0_4_);
  tcu::LogNumber<float>::write((LogNumber<float> *)&section_1,iVar8,__buf_02,(size_t)psVar17);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_340,"NormalizedReadCoefficient",&local_4f2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_360,"Normalized read coefficient",&local_4f3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_380,glcts::fixed_sample_locations_values + 1,&local_4f4);
  psVar17 = &local_380;
  local_4c8 = (float)local_4d8._4_4_;
  fStack_4c4 = (float)local_4d8._4_4_;
  fStack_4c0 = (float)local_4d8._4_4_;
  fStack_4bc = (float)local_4d8._4_4_;
  tcu::LogNumber<float>::LogNumber
            (&local_98,&local_340,&local_360,psVar17,QP_KEY_TAG_NONE,(float)local_4d8._4_4_);
  tcu::LogNumber<float>::write(&local_98,iVar8,__buf_03,(size_t)psVar17);
  tcu::LogNumber<float>::~LogNumber(&local_98);
  std::__cxx11::string::~string((string *)&local_380);
  std::__cxx11::string::~string((string *)&local_360);
  std::__cxx11::string::~string((string *)&local_340);
  tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&section_1);
  std::__cxx11::string::~string((string *)&local_320);
  std::__cxx11::string::~string((string *)&local_300);
  std::__cxx11::string::~string((string *)&local_2e0);
  tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&sortedSamples);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::~string((string *)&local_3e0);
  tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&rnd);
  std::__cxx11::string::~string((string *)&local_3c0);
  std::__cxx11::string::~string((string *)&local_3a0);
  std::__cxx11::string::~string((string *)&section);
  if ((0.5 < (float)local_4d8._0_4_) || ((float)local_4d8._0_4_ < 0.1)) {
    rnd.m_rnd._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    pdVar3 = &rnd.m_rnd.z;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)pdVar3);
    std::operator<<((ostream *)pdVar3,"Wait time is");
    pcVar18 = " NOT";
    if (0.5 < (float)local_4d8._0_4_) {
      pcVar18 = glcts::fixed_sample_locations_values + 1;
    }
    std::operator<<((ostream *)pdVar3,pcVar18);
    std::operator<<((ostream *)pdVar3," correlated to rendering workload size.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&rnd,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    rnd.m_rnd._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    pdVar3 = &rnd.m_rnd.z;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)pdVar3);
    std::operator<<((ostream *)pdVar3,
                    "Warning: Wait time correlation to rendering workload size is unclear.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&rnd,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&rnd.m_rnd.z);
  if ((0.5 < local_4c8) || ((float)local_4d8._4_4_ < 0.1)) {
    rnd.m_rnd._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    pdVar3 = &rnd.m_rnd.z;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)pdVar3);
    std::operator<<((ostream *)pdVar3,"Read time is");
    pcVar18 = " NOT";
    if (0.5 < local_4c8) {
      pcVar18 = glcts::fixed_sample_locations_values + 1;
    }
    std::operator<<((ostream *)pdVar3,pcVar18);
    std::operator<<((ostream *)pdVar3," correlated to rendering workload size.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&rnd,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    rnd.m_rnd._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    pdVar3 = &rnd.m_rnd.z;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)pdVar3);
    std::operator<<((ostream *)pdVar3,
                    "Warning: Read time correlation to rendering workload size is unclear.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&rnd,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&rnd.m_rnd.z);
  bVar7 = true;
  iVar8 = 0;
  pdVar3 = &rnd.m_rnd.z;
  do {
    if (iVar8 == 2) {
      pcVar18 = "Suspicious performance behavior";
      if (bVar7) {
        pcVar18 = "Pass";
      }
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                 (byte)~bVar7 & QP_TEST_RESULT_FAIL,pcVar18);
      std::_Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::
      ~_Vector_base(&readTimes.
                     super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                   );
      std::_Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::
      ~_Vector_base(&waitTimes.
                     super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                   );
      std::
      _Vector_base<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
      ::~_Vector_base(&local_4b0);
      return STOP;
    }
    bVar22 = iVar8 != 0;
    fVar23 = (float)local_4d8._0_4_;
    if (bVar22) {
      fVar23 = local_4c8;
    }
    pcVar18 = "render and read";
    if (!bVar22) {
      pcVar18 = "Finish and wait";
    }
    fVar4 = (&this->m_waitThreshold)[(ulong)bVar22 * 2];
    local_4e8.offset = fVar4;
    if ((&this->m_waitBehavior)[(ulong)bVar22 * 2] == EXPECT_COEF_GREATER_THAN) {
      pcVar20 = "greater than";
      if (fVar23 <= fVar4) {
LAB_00f1316f:
        rnd.m_rnd._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)pdVar3);
        std::operator<<((ostream *)pdVar3,"ERROR: Expected ");
        std::operator<<((ostream *)pdVar3,pcVar18 + 0xb);
        std::operator<<((ostream *)pdVar3," coefficient to be ");
        std::operator<<((ostream *)pdVar3,pcVar20);
        std::operator<<((ostream *)pdVar3," ");
        std::ostream::operator<<(pdVar3,local_4e8.offset);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&rnd,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)pdVar3);
        bVar7 = false;
      }
    }
    else {
      pcVar20 = (char *)0x0;
      if (((&this->m_waitBehavior)[(ulong)bVar22 * 2] != EXPECT_COEF_LESS_THAN) ||
         (pcVar20 = "less than", fVar4 <= fVar23)) goto LAB_00f1316f;
    }
    iVar8 = iVar8 + 1;
  } while( true );
}

Assistant:

FlushFinishCase::IterateResult FlushFinishCase::iterate (void)
{
	vector<Sample>		samples		(NUM_SAMPLES);
	CalibrationParams	params;

	tcu::warmupCPU();

	setupRenderState();

	// Do one full render cycle.
	{
		render(1);
		readPixels();
	}

	// Calibrate.
	try
	{
		params = calibrate();
	}
	catch (const CalibrationFailedException& e)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_COMPATIBILITY_WARNING, e.what());
		return STOP;
	}

	// Do measurement.
	{
		de::Random	rnd		(123);

		for (size_t ndx = 0; ndx < samples.size(); ndx++)
		{
			const int	drawCallCount	= rnd.getInt(1, params.maxDrawCalls);
			deUint64	waitStartTime;
			deUint64	readStartTime;
			deUint64	readFinishTime;

			render(drawCallCount);

			waitStartTime = deGetMicroseconds();
			waitForGL();

			readStartTime = deGetMicroseconds();
			readPixels();
			readFinishTime = deGetMicroseconds();

			samples[ndx].numDrawCalls	= drawCallCount;
			samples[ndx].waitTime		= readStartTime-waitStartTime;
			samples[ndx].readPixelsTime	= readFinishTime-readStartTime;

			if (m_testCtx.getWatchDog())
				qpWatchDog_touch(m_testCtx.getWatchDog());
		}
	}

	// Analyze - sets test case result.
	analyzeResults(samples, params);

	return STOP;
}